

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswCnf.c
# Opt level: O2

void Ssw_SatStop(Ssw_Sat_t *p)

{
  Vec_Int_t *__ptr;
  
  if (p->pSat != (sat_solver *)0x0) {
    sat_solver_delete(p->pSat);
  }
  __ptr = p->vSatVars;
  free(__ptr->pArray);
  free(__ptr);
  Vec_PtrFree(p->vFanins);
  Vec_PtrFree(p->vUsedPis);
  free(p);
  return;
}

Assistant:

void Ssw_SatStop( Ssw_Sat_t * p )
{
//    Abc_Print( 1, "Recycling SAT solver with %d vars and %d restarts.\n", 
//        p->pSat->size, p->pSat->stats.starts );
    if ( p->pSat )
        sat_solver_delete( p->pSat );
    Vec_IntFree( p->vSatVars );
    Vec_PtrFree( p->vFanins );
    Vec_PtrFree( p->vUsedPis );
    ABC_FREE( p );
}